

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_color_map.c
# Opt level: O0

int gdColorMapLookup(gdColorMap color_map,char *color_name,int *r,int *g,int *b)

{
  int iVar1;
  int iVar2;
  gdColorMapEntry *pgVar3;
  int result;
  int i;
  int high;
  int low;
  gdColorMapEntry *entries;
  int *b_local;
  int *g_local;
  int *r_local;
  char *color_name_local;
  gdColorMap color_map_local;
  
  pgVar3 = color_map.entries;
  i = 0;
  result = color_map.num_entries + -1;
  while( true ) {
    if (result < i) {
      return 0;
    }
    iVar1 = (i + result) / 2;
    iVar2 = strcmp(color_name,pgVar3[iVar1].color_name);
    if (iVar2 == 0) break;
    if (iVar2 < 0) {
      result = iVar1 + -1;
    }
    else {
      i = iVar1 + 1;
    }
  }
  *r = pgVar3[iVar1].red;
  *g = pgVar3[iVar1].green;
  *b = pgVar3[iVar1].blue;
  return 1;
}

Assistant:

BGD_DECLARE(int)
gdColorMapLookup(const gdColorMap color_map, const char *color_name, int *r, int *g, int *b)
{
	gdColorMapEntry *entries = color_map.entries;
	int low = 0;
	int high = color_map.num_entries - 1;
	while (low <= high) {
		int i = (low+high)/2;
		int result = strcmp(color_name, entries[i].color_name);
		if (result == 0) {
			*r = entries[i].red;
			*g = entries[i].green;
			*b = entries[i].blue;
			return 1;
		} else if (result < 0) {
			high = i - 1;
		} else {
			low = i + 1;
		}
	}
	return 0;
}